

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeKineticCorrFunc.cpp
# Opt level: O1

int __thiscall
OpenMD::ChargeKineticCorrFunc::computeProperty2
          (ChargeKineticCorrFunc *this,int frame,StuntDouble *sd)

{
  vector<double,std::allocator<double>> *this_00;
  int iVar1;
  DataStoragePointer DVar2;
  Snapshot *pSVar3;
  iterator __position;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Vector3d angMom;
  Mat3x3d I;
  double local_c8 [4];
  double local_a8 [18];
  
  DVar2 = sd->storage_;
  pSVar3 = sd->snapshotMan_->currentSnapshot_;
  lVar10 = (long)sd->localIndex_;
  lVar6 = *(long *)((long)&(pSVar3->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + DVar2);
  lVar5 = lVar10 * 0x18;
  pdVar8 = (double *)(lVar6 + lVar5);
  dVar11 = *pdVar8;
  dVar12 = pdVar8[1];
  (this->pos2_).super_Vector<double,_3U>.data_[2] = *(double *)(lVar6 + 0x10 + lVar5);
  (this->pos2_).super_Vector<double,_3U>.data_[0] = dVar11;
  (this->pos2_).super_Vector<double,_3U>.data_[1] = dVar12;
  lVar6 = *(long *)((long)&(pSVar3->atomData).velocity.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + DVar2);
  dVar11 = *(double *)(lVar6 + 0x10 + lVar5);
  dVar12 = *(double *)(lVar6 + 8 + lVar5);
  dVar11 = (dVar11 * dVar11 +
           *(double *)(lVar6 + lVar5) * *(double *)(lVar6 + lVar5) + dVar12 * dVar12) * sd->mass_ +
           0.0;
  local_c8[2] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_a8[8] = 0.0;
  local_a8[6] = 0.0;
  local_a8[7] = 0.0;
  local_a8[4] = 0.0;
  local_a8[5] = 0.0;
  local_a8[2] = 0.0;
  local_a8[3] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  if (sd->objType_ - otDAtom < 2) {
    lVar6 = *(long *)((long)&(pSVar3->atomData).angularMomentum.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar2);
    local_c8[2] = *(double *)(lVar6 + 0x10 + lVar10 * 0x18);
    pdVar8 = (double *)(lVar6 + lVar10 * 0x18);
    local_c8[0] = *pdVar8;
    local_c8[1] = pdVar8[1];
    local_c8[3] = dVar11;
    (*sd->_vptr_StuntDouble[5])(local_a8 + 9,sd);
    lVar6 = 0;
    do {
      *(undefined8 *)((long)local_a8 + lVar6 + 0x10) =
           *(undefined8 *)((long)local_a8 + lVar6 + 0x58);
      *(undefined8 *)((long)local_a8 + lVar6) = *(undefined8 *)((long)local_a8 + lVar6 + 0x48);
      *(undefined8 *)((long)local_a8 + lVar6 + 8) = *(undefined8 *)((long)local_a8 + lVar6 + 0x50);
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x48);
    if (sd->linear_ == true) {
      iVar1 = sd->linearAxis_;
      uVar9 = (ulong)(((iVar1 + 1) / 3) * -3 + iVar1 + 1);
      uVar7 = (ulong)(iVar1 + ((iVar1 + 2) / 3) * -3 + 2);
      dVar11 = (local_c8[uVar9] * local_c8[uVar9]) / local_a8[uVar9 * 4];
      dVar12 = local_c8[uVar7] * local_c8[uVar7];
      pdVar8 = local_a8 + uVar7 * 4;
    }
    else {
      pdVar8 = local_a8 + 8;
      auVar13._0_8_ = local_c8[0] * local_c8[0];
      auVar13._8_8_ = local_c8[1] * local_c8[1];
      auVar14._8_4_ = SUB84(local_a8[4],0);
      auVar14._0_8_ = local_a8[0];
      auVar14._12_4_ = (int)((ulong)local_a8[4] >> 0x20);
      auVar14 = divpd(auVar13,auVar14);
      dVar11 = auVar14._8_8_ + auVar14._0_8_;
      dVar12 = local_c8[2] * local_c8[2];
    }
    dVar11 = local_c8[3] + dVar12 / *pdVar8 + dVar11;
  }
  this->propertyTemp = dVar11 * 0.5;
  this_00 = (vector<double,std::allocator<double>> *)
            ((this->kinetic_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frame);
  __position._M_current = *(double **)(this_00 + 8);
  if (__position._M_current == *(double **)(this_00 + 0x10)) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              (this_00,__position,&this->propertyTemp);
  }
  else {
    *__position._M_current = dVar11 * 0.5;
    *(double **)(this_00 + 8) = __position._M_current + 1;
  }
  this->sumKinetic_ = this->propertyTemp + this->sumKinetic_;
  this->kineticCount_ = this->kineticCount_ + 1;
  pvVar4 = (this->kinetic_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (int)((ulong)((long)pvVar4[frame].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      *(long *)&pvVar4[frame].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data) >> 3) + -1;
}

Assistant:

int ChargeKineticCorrFunc::computeProperty2(int frame, StuntDouble* sd) {
    RealType kinetic(0.0);
    pos2_ = sd->getPos();

    RealType mass = sd->getMass();
    Vector3d vel  = sd->getVel();

    kinetic += mass * (vel[0] * vel[0] + vel[1] * vel[1] + vel[2] * vel[2]);

    Vector3d angMom;
    Mat3x3d I;
    int i, j, k;

    if (sd->isDirectional()) {
      angMom = sd->getJ();
      I      = sd->getI();

      if (sd->isLinear()) {
        i = sd->linearAxis();
        j = (i + 1) % 3;
        k = (i + 2) % 3;
        kinetic +=
            angMom[j] * angMom[j] / I(j, j) + angMom[k] * angMom[k] / I(k, k);
      } else {
        kinetic += angMom[0] * angMom[0] / I(0, 0) +
                   angMom[1] * angMom[1] / I(1, 1) +
                   angMom[2] * angMom[2] / I(2, 2);
      }
    }
    propertyTemp = 0.5 * kinetic;
    kinetic_[frame].push_back(propertyTemp);
    sumKinetic_ += propertyTemp;
    kineticCount_++;
    return kinetic_[frame].size() - 1;
  }